

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

uchar * extra_open_record(uchar *bp,int dr_len,isoent *isoent,ctl_extr_rec *ctl)

{
  ctl_extr_rec *ctl_local;
  isoent *isoent_local;
  uchar *puStack_10;
  int dr_len_local;
  uchar *bp_local;
  
  ctl->bp = bp;
  puStack_10 = bp;
  if (bp != (uchar *)0x0) {
    puStack_10 = bp + dr_len;
  }
  ctl->use_extr = 0;
  ctl->isoent = isoent;
  ctl->ce_ptr = (uchar *)0x0;
  ctl->dr_len = dr_len;
  ctl->cur_len = dr_len;
  ctl->limit = 0xe2;
  return puStack_10;
}

Assistant:

static unsigned char *
extra_open_record(unsigned char *bp, int dr_len, struct isoent *isoent,
    struct ctl_extr_rec *ctl)
{
	ctl->bp = bp;
	if (bp != NULL)
		bp += dr_len;
	ctl->use_extr = 0;
	ctl->isoent = isoent;
	ctl->ce_ptr = NULL;
	ctl->cur_len = ctl->dr_len = dr_len;
	ctl->limit = DR_LIMIT;

	return (bp);
}